

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkTraversalsCache.cpp
# Opt level: O2

void __thiscall iDynTree::LinkTraversalsCache::deleteTraversals(LinkTraversalsCache *this)

{
  pointer ppTVar1;
  Traversal *this_00;
  size_t link;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppTVar1 = (this->m_linkTraversals).
                super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->m_linkTraversals).
                            super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00 = ppTVar1[uVar2];
    if (this_00 != (Traversal *)0x0) {
      Traversal::~Traversal(this_00);
    }
    operator_delete(this_00,0x60);
  }
  std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::resize
            (&this->m_linkTraversals,0);
  return;
}

Assistant:

void LinkTraversalsCache::deleteTraversals()
{
    for(size_t link=0; link < m_linkTraversals.size(); link++)
    {
        delete m_linkTraversals[link];
    }
    m_linkTraversals.resize(0);
}